

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatchTest.h
# Opt level: O2

void __thiscall
oout::MatchTest::MatchTest<oout::ContainMatch>
          (MatchTest *this,shared_ptr<const_oout::Text> *text,shared_ptr<const_oout::Match> *match1,
          shared_ptr<const_oout::Match> *match2,shared_ptr<oout::ContainMatch> *matchn)

{
  shared_ptr<const_oout::Match> local_48;
  shared_ptr<const_oout::Match> local_38;
  
  std::
  make_shared<oout::AllMatch,std::shared_ptr<oout::Match_const>const&,std::shared_ptr<oout::Match_const>const&,std::shared_ptr<oout::ContainMatch>const&>
            (&local_48,match1,(shared_ptr<oout::ContainMatch> *)match2);
  local_38.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_48.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_48.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_48.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  MatchTest(this,text,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

MatchTest(
		const std::shared_ptr<const Text> &text,
		const std::shared_ptr<const Match> &match1,
		const std::shared_ptr<const Match> &match2,
		const std::shared_ptr<T> & ... matchn
	) : MatchTest(text, std::make_shared<AllMatch>(match1, match2, matchn...))
	{
	}